

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IFF_ATC_NAVAIDS_FundamentalParameterData *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  IFF_ATC_NAVAIDS_FundamentalParameterData *local_18;
  IFF_ATC_NAVAIDS_FundamentalParameterData *this_local;
  
  local_18 = this;
  this_local = (IFF_ATC_NAVAIDS_FundamentalParameterData *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"IFF/ATC/NAVAID Fundamental Parameter Data:");
  poVar1 = std::operator<<(poVar1,"\n\tERP:              ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32ERP);
  poVar1 = std::operator<<(poVar1,"\n\tFrequency:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Freq);
  poVar1 = std::operator<<(poVar1,"\n\tPgRF:             ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32PgRF);
  poVar1 = std::operator<<(poVar1,"\n\tPulse Width:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32PulseWidth);
  poVar1 = std::operator<<(poVar1,"\n\tBurst Length:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32BurstLength);
  poVar1 = std::operator<<(poVar1,"\n\tApplicable Modes: ");
  ENUMS::GetEnumAsStringSystemMode_abi_cxx11_(&local_1d0,(ENUMS *)(ulong)this->m_ui8AppMode,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IFF_ATC_NAVAIDS_FundamentalParameterData::GetAsString() const
{
    KStringStream ss;

    ss << "IFF/ATC/NAVAID Fundamental Parameter Data:"
       << "\n\tERP:              " << m_f32ERP
       << "\n\tFrequency:        " << m_f32Freq
       << "\n\tPgRF:             " << m_f32PgRF
       << "\n\tPulse Width:      " << m_f32PulseWidth
       << "\n\tBurst Length:     " << m_ui32BurstLength
       << "\n\tApplicable Modes: " << GetEnumAsStringSystemMode( m_ui8AppMode )
       << "\n";

    return ss.str();
}